

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1522.c
# Opt level: O0

int sockopt_callback(void *clientp,curl_socket_t curlfd,curlsocktype purpose)

{
  undefined4 local_1c;
  curlsocktype local_18;
  int sndbufsize;
  curlsocktype purpose_local;
  curl_socket_t curlfd_local;
  void *clientp_local;
  
  local_1c = 0x1000;
  local_18 = purpose;
  sndbufsize = curlfd;
  _purpose_local = clientp;
  setsockopt(curlfd,1,7,&local_1c,4);
  return 0;
}

Assistant:

static int sockopt_callback(void *clientp, curl_socket_t curlfd,
                            curlsocktype purpose)
{
#if defined(SOL_SOCKET) && defined(SO_SNDBUF)
  int sndbufsize = 4 * 1024; /* 4KB send buffer */
  (void) clientp;
  (void) purpose;
  setsockopt(curlfd, SOL_SOCKET, SO_SNDBUF,
             (const char *)&sndbufsize, sizeof(sndbufsize));
#else
  (void)clientp;
  (void)curlfd;
  (void)purpose;
#endif
  return CURL_SOCKOPT_OK;
}